

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupport_c_failureWithParameterOfTypeCoversValueToString_TestShell::
~TEST_MockSupport_c_failureWithParameterOfTypeCoversValueToString_TestShell
          (TEST_MockSupport_c_failureWithParameterOfTypeCoversValueToString_TestShell *this)

{
  TEST_MockSupport_c_failureWithParameterOfTypeCoversValueToString_TestShell *this_local;
  
  ~TEST_MockSupport_c_failureWithParameterOfTypeCoversValueToString_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockSupport_c, failureWithParameterOfTypeCoversValueToString)
{
    TestTestingFixture fixture;
    mock_c()->installComparator("typeName", typeNameIsEqual, typeNameValueToString);
    fixture.setTestFunction(failingCallToMockCWithParameterOfType_);
    fixture.runAllTests();
    fixture.assertPrintContains("typeName name: <valueToString>");
    mock_c()->removeAllComparatorsAndCopiers();
}